

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O2

void __thiscall
Potassco::TheoryAtom::TheoryAtom(TheoryAtom *this,Id_t a,Id_t term,IdSpan *args,Id_t *op,Id_t *rhs)

{
  ulong uVar1;
  uint32_t uVar2;
  
  *(uint *)this = (uint)(op != (Id_t *)0x0) << 0x1f | a & 0x7fffffff;
  this->termId_ = term;
  uVar1 = args->size;
  uVar2 = (uint32_t)uVar1;
  this->nTerms_ = uVar2;
  if (uVar2 != 0) {
    memcpy(this + 1,args->first,(uVar1 & 0xffffffff) << 2);
  }
  if (op != (Id_t *)0x0) {
    *(Id_t *)(&this[1].field_0x0 + (uVar1 & 0xffffffff) * 4) = *op;
    *(Id_t *)(&this[1].field_0x0 + (ulong)(uVar2 + 1) * 4) = *rhs;
  }
  return;
}

Assistant:

TheoryAtom::TheoryAtom(Id_t a, Id_t term, const IdSpan& args, Id_t* op, Id_t* rhs)
	: atom_(a)
	, guard_(op != 0)
	, termId_(term)
	, nTerms_(static_cast<uint32_t>(Potassco::size(args))) {
	nTerms_ == 0 || std::memcpy(term_, Potassco::begin(args), nTerms_ * sizeof(Id_t));
	if (op) {
		term_[nTerms_] = *op;
		term_[nTerms_ + 1] = *rhs;
	}
}